

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpRelaxation.cpp
# Opt level: O0

void __thiscall HighsLpRelaxation::removeCuts(HighsLpRelaxation *this)

{
  HighsInt HVar1;
  reference pvVar2;
  undefined8 *in_RDI;
  vector<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_> *unaff_retaddr;
  HighsInt in_stack_0000000c;
  HighsCutPool *in_stack_00000010;
  HighsInt i;
  HighsInt modelrows;
  HighsInt nlprows;
  HighsInt in_stack_00000060;
  HighsInt in_stack_00000064;
  Highs *in_stack_00000068;
  int local_14;
  undefined8 *__new_size;
  
  __new_size = in_RDI;
  HVar1 = Highs::getNumRow((Highs *)(in_RDI + 1));
  local_14 = HighsMipSolver::numRow((HighsMipSolver *)*in_RDI);
  Highs::deleteRows(in_stack_00000068,in_stack_00000064,in_stack_00000060);
  for (; local_14 != HVar1; local_14 = local_14 + 1) {
    pvVar2 = std::vector<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>::
             operator[]((vector<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>
                         *)(in_RDI + 0xa39),(long)local_14);
    if (pvVar2->origin == kCutPool) {
      std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                 0x6063ed);
      std::vector<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>::operator[]
                ((vector<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_> *)
                 (in_RDI + 0xa39),(long)local_14);
      HighsCutPool::lpCutRemoved(in_stack_00000010,in_stack_0000000c);
    }
  }
  std::vector<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>::resize
            (unaff_retaddr,(size_type)__new_size);
  return;
}

Assistant:

void HighsLpRelaxation::removeCuts() {
  assert(lpsolver.getLp().num_row_ ==
         (HighsInt)lpsolver.getLp().row_lower_.size());
  HighsInt nlprows = lpsolver.getNumRow();
  HighsInt modelrows = mipsolver.numRow();

  lpsolver.deleteRows(modelrows, nlprows - 1);
  for (HighsInt i = modelrows; i != nlprows; ++i) {
    if (lprows[i].origin == LpRow::Origin::kCutPool)
      mipsolver.mipdata_->cutpool.lpCutRemoved(lprows[i].index);
  }
  lprows.resize(modelrows);
  assert(lpsolver.getLp().num_row_ ==
         (HighsInt)lpsolver.getLp().row_lower_.size());
}